

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_table_calculation.cpp
# Opt level: O0

void __thiscall
ParseTableCalculation::printItemSets
          (ParseTableCalculation *this,
          list<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
          *item_sets)

{
  int iVar1;
  bool bVar2;
  ostream *poVar3;
  reference this_00;
  reference pIVar4;
  reference pvVar5;
  size_type sVar6;
  reference pvVar7;
  int local_64;
  int i_1;
  Item *item;
  iterator __end2;
  iterator __begin2;
  set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
  *__range2;
  set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
  *set;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
  *__range1;
  int i;
  list<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
  *item_sets_local;
  ParseTableCalculation *this_local;
  
  __range1._4_4_ = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"Item sets");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1 = std::__cxx11::
           list<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
           ::begin(item_sets);
  set = (set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
         *)std::__cxx11::
           list<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>,_std::allocator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>_>
           ::end(item_sets);
  while( true ) {
    bVar2 = std::operator!=(&__end1,(_Self *)&set);
    if (!bVar2) break;
    this_00 = std::
              _List_const_iterator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>
              ::operator*(&__end1);
    poVar3 = std::operator<<((ostream *)&std::cout,"\tState [");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,__range1._4_4_);
    std::operator<<(poVar3,"]\n");
    __end2 = std::
             set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
             ::begin(this_00);
    item = (Item *)std::
                   set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>
                   ::end(this_00);
    while( true ) {
      bVar2 = std::operator!=(&__end2,(_Self *)&item);
      if (!bVar2) break;
      pIVar4 = std::_Rb_tree_const_iterator<ParseTableCalculation::Item>::operator*(&__end2);
      std::operator<<((ostream *)&std::cout,"\t\t");
      local_64 = 0;
      while( true ) {
        pvVar5 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&this->rules_,(long)pIVar4->ruleIndex);
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(pvVar5);
        if ((int)sVar6 <= local_64) break;
        if (local_64 == pIVar4->dotPosition) {
          std::operator<<((ostream *)&std::cout,".");
        }
        pvVar5 = std::
                 vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::operator[](&this->rules_,(long)pIVar4->ruleIndex);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvVar5,(long)local_64);
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)pvVar7);
        std::operator<<(poVar3," ");
        local_64 = local_64 + 1;
      }
      iVar1 = pIVar4->dotPosition;
      pvVar5 = std::
               vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator[](&this->rules_,(long)pIVar4->ruleIndex);
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(pvVar5);
      if (iVar1 == (int)sVar6) {
        std::operator<<((ostream *)&std::cout,".");
      }
      poVar3 = std::operator<<((ostream *)&std::cout," | ");
      poVar3 = std::operator<<(poVar3,(string *)&pIVar4->lookahead);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::_Rb_tree_const_iterator<ParseTableCalculation::Item>::operator++(&__end2);
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    __range1._4_4_ = __range1._4_4_ + 1;
    std::
    _List_const_iterator<std::set<ParseTableCalculation::Item,_std::less<ParseTableCalculation::Item>,_std::allocator<ParseTableCalculation::Item>_>_>
    ::operator++(&__end1);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ParseTableCalculation::printItemSets(const std::list<std::set<Item>>& item_sets)
{
	int i = 0;
	std::cout << "Item sets" << std::endl;
	for (auto& set : item_sets)
	{
		std::cout << "\tState [" << i << "]\n";
		for (const Item& item : set)
		{
			std::cout << "\t\t";
			for (int i = 0; i < static_cast<int>(rules_[item.ruleIndex].size()); ++i)
			{
				if (i == item.dotPosition)
				{
					std::cout << ".";
				}
				std::cout << rules_[item.ruleIndex][i] << " ";
			}
			if (item.dotPosition == static_cast<int>(rules_[item.ruleIndex].size()))
			{
				std::cout << ".";
			}
			std::cout << " | " << item.lookahead << std::endl;
		}
		std::cout << std::endl;
		++i;
	}
	std::cout << std::endl;
}